

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O3

int mg_raw_transport_init(int sockfd,mg_raw_transport **transport,mg_allocator *allocator)

{
  int iVar1;
  mg_raw_transport *pmVar2;
  
  pmVar2 = (mg_raw_transport *)mg_allocator_malloc(allocator,0x38);
  if (pmVar2 == (mg_raw_transport *)0x0) {
    iVar1 = -3;
  }
  else {
    pmVar2->sockfd = sockfd;
    pmVar2->send = mg_raw_transport_send;
    pmVar2->recv = mg_raw_transport_recv;
    pmVar2->destroy = mg_raw_transport_destroy;
    pmVar2->suspend_until_ready_to_read = mg_raw_transport_suspend_until_ready_to_read;
    pmVar2->suspend_until_ready_to_write = mg_raw_transport_suspend_until_ready_to_write;
    pmVar2->allocator = allocator;
    *transport = pmVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mg_raw_transport_init(int sockfd, mg_raw_transport **transport,
                          mg_allocator *allocator) {
  mg_raw_transport *ttransport =
      mg_allocator_malloc(allocator, sizeof(mg_raw_transport));
  if (!ttransport) {
    return MG_ERROR_OOM;
  }
  ttransport->sockfd = sockfd;
  ttransport->send = mg_raw_transport_send;
  ttransport->recv = mg_raw_transport_recv;
  ttransport->destroy = mg_raw_transport_destroy;
  ttransport->suspend_until_ready_to_read =
      mg_raw_transport_suspend_until_ready_to_read;
  ttransport->suspend_until_ready_to_write =
      mg_raw_transport_suspend_until_ready_to_write;
  ttransport->allocator = allocator;
  *transport = ttransport;
  return 0;
}